

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::DiskSourceTree::MapPath
          (DiskSourceTree *this,string *virtual_path,string *disk_path)

{
  string local_a0;
  string local_80;
  Mapping local_60;
  string *local_20;
  string *disk_path_local;
  string *virtual_path_local;
  DiskSourceTree *this_local;
  
  local_20 = disk_path;
  disk_path_local = virtual_path;
  virtual_path_local = (string *)this;
  std::__cxx11::string::string((string *)&local_a0,(string *)disk_path);
  CanonicalizePath(&local_80,&local_a0);
  Mapping::Mapping(&local_60,virtual_path,&local_80);
  std::
  vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  ::push_back(&this->mappings_,&local_60);
  Mapping::~Mapping(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void DiskSourceTree::MapPath(const string& virtual_path,
                             const string& disk_path) {
  mappings_.push_back(Mapping(virtual_path, CanonicalizePath(disk_path)));
}